

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int mapViableBiome(Layer *l,int *out,int x,int z,int w,int h)

{
  undefined4 uVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int biomeID;
  int j;
  int i;
  int styp;
  int err;
  int local_38;
  int local_34;
  int local_4;
  
  local_4 = mapBiome(_styp,_j,biomeID,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  if (local_4 == 0) {
    uVar1 = **(undefined4 **)(in_RDI + 0x30);
    for (local_38 = 0; local_38 < in_R9D; local_38 = local_38 + 1) {
      for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
        iVar2 = *(int *)(in_RSI + (long)(local_34 + in_R8D * local_38) * 4);
        switch(uVar1) {
        case 1:
        case 0x10:
          if ((iVar2 == 2) || (iVar2 = isMesa(iVar2), iVar2 != 0)) {
            return 0;
          }
          break;
        case 2:
          if (iVar2 == 0x15) {
            return 0;
          }
          break;
        case 3:
          if (iVar2 == 6) {
            return 0;
          }
          break;
        case 4:
          if ((iVar2 == 0xc) || (iVar2 == 0x1e)) {
            return 0;
          }
          break;
        default:
          return 0;
        case 6:
        case 7:
        case 8:
          iVar2 = isOceanic(iVar2);
          if (iVar2 != 0) {
            return 0;
          }
          break;
        case 9:
          if (iVar2 == 0x1d) {
            return 0;
          }
          break;
        case 0xe:
          iVar2 = isOceanic(iVar2);
          if (iVar2 != 0) {
            return 0;
          }
        }
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int mapViableBiome(const Layer * l, int * out, int x, int z, int w, int h)
{
    int err = mapBiome(l, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    int styp = ((const int*) l->data)[0];
    int i, j;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int biomeID = out[i + w*j];
            switch (styp)
            {
            case Desert_Pyramid:
            case Desert_Well:
                if (biomeID == desert || isMesa(biomeID))
                    return 0;
                break;
            case Jungle_Pyramid:
                if (biomeID == jungle)
                    return 0;
                break;
            case Swamp_Hut:
                if (biomeID == swamp)
                    return 0;
                break;
            case Igloo:
                if (biomeID == snowy_tundra || biomeID == snowy_taiga)
                    return 0;
                break;
            case Treasure:
                if (isOceanic(biomeID))
                    return 0;
                break;
            case Ocean_Ruin:
            case Shipwreck:
            case Monument:
                if (isOceanic(biomeID))
                    return 0;
                break;
            case Mansion:
                if (biomeID == dark_forest)
                    return 0;
                break;
            default:
                return 0;
            }
        }
    }

    return 1; // required biomes not found: set err status to stop generator
}